

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handleapi.cpp
# Opt level: O1

PAL_ERROR CorUnix::InternalCloseHandle(CPalThread *pThread,HANDLE hObject)

{
  bool bVar1;
  PAL_ERROR PVar2;
  
  bVar1 = HandleIsSpecial(hObject);
  if (bVar1) {
    PVar2 = 6;
    if ((undefined1 *)hObject == &DAT_ffffff01) {
      PVar2 = 0;
    }
    if ((undefined1 *)hObject == &DAT_ffffff03) {
      PVar2 = 0;
    }
    return PVar2;
  }
  PVar2 = (**(code **)(*g_pObjectManager + 0x20))(g_pObjectManager,pThread,hObject);
  return PVar2;
}

Assistant:

PAL_ERROR
CorUnix::InternalCloseHandle(
    CPalThread * pThread,
    HANDLE hObject
    )
{
    PAL_ERROR palError = NO_ERROR;

    if (!HandleIsSpecial(hObject))
    {
        palError = g_pObjectManager->RevokeHandle(
            pThread,
            hObject
            );
    }
    else
    {
        palError = CloseSpecialHandle(hObject);
    }

    return palError;
}